

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O3

void __thiscall MeCab::ContextID::addBOS(ContextID *this,char *l,char *r)

{
  char *pcVar1;
  
  pcVar1 = (char *)(this->left_bos_)._M_string_length;
  strlen(l);
  std::__cxx11::string::_M_replace((ulong)&this->left_bos_,0,pcVar1,(ulong)l);
  pcVar1 = (char *)(this->right_bos_)._M_string_length;
  strlen(r);
  std::__cxx11::string::_M_replace((ulong)&this->right_bos_,0,pcVar1,(ulong)r);
  return;
}

Assistant:

void ContextID::addBOS(const char *l, const char *r) {
  left_bos_ = l;
  right_bos_ = r;
}